

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * SBGThread(void *pParam)

{
  int iVar1;
  undefined1 local_11e0 [8];
  SBGDATA sbgdata;
  int err;
  int res;
  int id;
  SBG *pSBG;
  void *pParam_local;
  
  err = 0;
  sbgdata.Yaw._4_4_ = 0;
  do {
    if (addrsSBG[err] == pParam) {
      memset(local_11e0,0,0x11b0);
      do {
        iVar1 = GetFrameSBG((SBG *)pParam,(SBGDATA *)local_11e0);
        if (iVar1 != 0) {
          sbgdata.Yaw._4_4_ = iVar1;
        }
        EnterCriticalSection(SBGCS + err);
        memcpy(sbgdataSBG + err,local_11e0,0x11b0);
        resSBG[err] = sbgdata.Yaw._4_4_;
        LeaveCriticalSection(SBGCS + err);
      } while (bExitSBG[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGThread(void* pParam)
{
	SBG* pSBG = (SBG*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	SBGDATA sbgdata;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&sbgdata, 0, sizeof(SBGDATA));
	for (;;)
	{
#ifdef ENABLE_SBG_SDK_SUPPORT
		mSleep(pSBG->threadperiod);
#endif // ENABLE_SBG_SDK_SUPPORT
		//memset(&sbgdata, 0, sizeof(SBGDATA));
#ifdef ENABLE_SBG_SDK_SUPPORT
		res = GetLatestDataSBG(pSBG, &sbgdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetLatestDataSBG(pSBG, &sbgdata) == EXIT_SUCCESS)
#else
		res = GetFrameSBG(pSBG, &sbgdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetFrameSBG(pSBG, &sbgdata) == EXIT_SUCCESS)
#endif // ENABLE_SBG_SDK_SUPPORT
		{
			EnterCriticalSection(&SBGCS[id]);
			sbgdataSBG[id] = sbgdata;
			resSBG[id] = err;
			LeaveCriticalSection(&SBGCS[id]);
		}
		if (bExitSBG[id]) break;
	}

	return 0;
}